

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_service.c
# Opt level: O0

RK_S32 mpp_service_ioctl(RK_S32 fd,RK_U32 cmd,RK_U32 size,void *param)

{
  int iVar1;
  RK_U32 local_38 [2];
  MppReqV1 mpp_req;
  void *param_local;
  RK_U32 size_local;
  RK_U32 cmd_local;
  RK_S32 fd_local;
  
  mpp_req.data_ptr = (RK_U64)param;
  memset(local_38,0,0x18);
  local_38[1] = 0;
  mpp_req.flag = 0;
  mpp_req.size = (undefined4)mpp_req.data_ptr;
  mpp_req.offset = mpp_req.data_ptr._4_4_;
  local_38[0] = cmd;
  mpp_req.cmd = size;
  iVar1 = ioctl(fd,0x40047601,local_38);
  return iVar1;
}

Assistant:

RK_S32 mpp_service_ioctl(RK_S32 fd, RK_U32 cmd, RK_U32 size, void *param)
{
    MppReqV1 mpp_req;

    memset(&mpp_req, 0, sizeof(mpp_req));

    mpp_req.cmd = cmd;
    mpp_req.flag = 0;
    mpp_req.size = size;
    mpp_req.offset = 0;
    mpp_req.data_ptr = REQ_DATA_PTR(param);

    return (RK_S32)ioctl(fd, MPP_IOC_CFG_V1, &mpp_req);
}